

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefCast(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Index IVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  Expression *ref;
  RefCast *pRVar5;
  bool local_71;
  HeapType local_38;
  HeapType local_30;
  uintptr_t local_28;
  Type local_20;
  Type refType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  refType.id = (uintptr_t)this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isRef((Type *)&this_local);
  if (!bVar1) {
    __assert_fail("type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12c8,"Expression *wasm::TranslateToFuzzReader::makeRefCast(Type)");
  }
  bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
  local_71 = false;
  if (bVar1) {
    local_71 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x178));
  }
  if (local_71 == false) {
    __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12c9,"Expression *wasm::TranslateToFuzzReader::makeRefCast(Type)");
  }
  Type::Type(&local_20);
  IVar2 = upTo(this,3);
  if (IVar2 == 0) {
    local_28 = (uintptr_t)getReferenceType(this);
    local_20 = (Type)local_28;
    local_30 = Type::getHeapType(&local_20);
    BVar3 = HeapType::getBottom(&local_30);
    local_38 = Type::getHeapType((Type *)&this_local);
    BVar4 = HeapType::getBottom(&local_38);
    if (BVar3 == BVar4) goto LAB_001c1214;
  }
  else if (IVar2 != 1) {
    if (IVar2 != 2) {
      wasm::handle_unreachable
                ("bad case",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x12e4);
    }
    local_20 = getSubType(this,(Type)this_local);
    goto LAB_001c1214;
  }
  local_20 = getSuperType(this,(Type)this_local);
LAB_001c1214:
  ref = make(this,local_20);
  pRVar5 = Builder::makeRefCast(&this->builder,ref,(Type)this_local);
  return (Expression *)pRVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefCast(Type type) {
  assert(type.isRef());
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  // As with RefTest, use possibly related types. Unlike there, we are given the
  // output type, which is the cast type, so just generate the ref's type.
  Type refType;
  switch (upTo(3)) {
    case 0:
      // Totally random.
      refType = getReferenceType();
      // They must share a bottom type in order to validate.
      if (refType.getHeapType().getBottom() == type.getHeapType().getBottom()) {
        break;
      }
      // Otherwise, fall through and generate things in a way that is
      // guaranteed to validate.
      [[fallthrough]];
    case 1: {
      // Cast is a subtype of ref. We can't modify |type|, so find a supertype
      // for the ref.
      refType = getSuperType(type);
      break;
    }
    case 2:
      // Ref is a subtype of cast.
      refType = getSubType(type);
      break;
    default:
      // This unreachable avoids a warning on refType being possibly undefined.
      WASM_UNREACHABLE("bad case");
  }
  return builder.makeRefCast(make(refType), type);
}